

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O0

Abc_Ntk_t * Abc_DesDeriveRoot(Abc_Des_t *p)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Des_t *p_local;
  
  iVar1 = Vec_PtrSize(p->vModules);
  if (iVar1 < 2) {
    p_local = (Abc_Des_t *)Vec_PtrEntry(p->vModules,0);
    Vec_PtrClear(p->vModules);
    p_local[4].tModules = (st__table *)p->pManFunc;
    p->pManFunc = (void *)0x0;
  }
  else {
    printf("The design includes more than one module and is currently not used.\n");
    p_local = (Abc_Des_t *)0x0;
  }
  return (Abc_Ntk_t *)p_local;
}

Assistant:

Abc_Ntk_t * Abc_DesDeriveRoot( Abc_Des_t * p )
{
    Abc_Ntk_t * pNtk;
    if ( Vec_PtrSize(p->vModules) > 1 )
    {
        printf( "The design includes more than one module and is currently not used.\n" );
        return NULL;
    }
    pNtk = (Abc_Ntk_t *)Vec_PtrEntry( p->vModules, 0 );  Vec_PtrClear( p->vModules );
    pNtk->pManFunc = p->pManFunc;           p->pManFunc = NULL;
    return pNtk;
}